

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int __thiscall s2pred::CompareDistances(s2pred *this,S2Point *x,S2Point *a,S2Point *b)

{
  bool bVar1;
  int iVar2;
  Vector3_xf local_168;
  Vector3_xf local_128;
  Vector3_xf local_f8;
  Vector3_ld local_c8;
  Vector3_ld local_98;
  Vector3_ld local_68;
  double local_38;
  double cos_ax;
  S2Point *pSStack_28;
  int sign;
  S2Point *b_local;
  S2Point *a_local;
  S2Point *x_local;
  
  pSStack_28 = a;
  b_local = x;
  a_local = (S2Point *)this;
  cos_ax._4_4_ = TriageCompareCosDistances<double>((Vector3<double> *)this,x,a);
  x_local._4_4_ = cos_ax._4_4_;
  if (cos_ax._4_4_ == 0) {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)b_local,pSStack_28);
    if (bVar1) {
      x_local._4_4_ = 0;
    }
    else {
      local_38 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                           ((BasicVector<Vector3,_double,_3UL> *)b_local,a_local);
      if (local_38 <= 0.7071067811865476) {
        if (-0.7071067811865476 <= local_38) {
          ToLD(&local_68,a_local);
          ToLD(&local_98,b_local);
          ToLD(&local_c8,pSStack_28);
          cos_ax._4_4_ = TriageCompareCosDistances<long_double>
                                   ((s2pred *)&local_68,&local_98,&local_c8,
                                    (Vector3<long_double> *)b);
        }
        else {
          iVar2 = CompareSin2Distances((s2pred *)a_local,b_local,pSStack_28,b);
          cos_ax._4_4_ = -iVar2;
        }
      }
      else {
        cos_ax._4_4_ = CompareSin2Distances((s2pred *)a_local,b_local,pSStack_28,b);
      }
      if (cos_ax._4_4_ == 0) {
        ToExact(&local_f8,a_local);
        ToExact(&local_128,b_local);
        ToExact(&local_168,pSStack_28);
        cos_ax._4_4_ = ExactCompareDistances(&local_f8,&local_128,&local_168);
        Vector3<ExactFloat>::~Vector3(&local_168);
        Vector3<ExactFloat>::~Vector3(&local_128);
        Vector3<ExactFloat>::~Vector3(&local_f8);
        if (cos_ax._4_4_ == 0) {
          x_local._4_4_ = SymbolicCompareDistances(a_local,b_local,pSStack_28);
        }
        else {
          x_local._4_4_ = cos_ax._4_4_;
        }
      }
      else {
        x_local._4_4_ = cos_ax._4_4_;
      }
    }
  }
  return x_local._4_4_;
}

Assistant:

int CompareDistances(const S2Point& x, const S2Point& a, const S2Point& b) {
  // We start by comparing distances using dot products (i.e., cosine of the
  // angle), because (1) this is the cheapest technique, and (2) it is valid
  // over the entire range of possible angles.  (We can only use the sin^2
  // technique if both angles are less than 90 degrees or both angles are
  // greater than 90 degrees.)
  int sign = TriageCompareCosDistances(x, a, b);
  if (sign != 0) return sign;

  // Optimization for (a == b) to avoid falling back to exact arithmetic.
  if (a == b) return 0;

  // It is much better numerically to compare distances using cos(angle) if
  // the distances are near 90 degrees and sin^2(angle) if the distances are
  // near 0 or 180 degrees.  We only need to check one of the two angles when
  // making this decision because the fact that the test above failed means
  // that angles "a" and "b" are very close together.
  double cos_ax = a.DotProd(x);
  if (cos_ax > M_SQRT1_2) {
    // Angles < 45 degrees.
    sign = CompareSin2Distances(x, a, b);
  } else if (cos_ax < -M_SQRT1_2) {
    // Angles > 135 degrees.  sin^2(angle) is decreasing in this range.
    sign = -CompareSin2Distances(x, a, b);
  } else {
    // We've already tried double precision, so continue with "long double".
    sign = TriageCompareCosDistances(ToLD(x), ToLD(a), ToLD(b));
  }
  if (sign != 0) return sign;
  sign = ExactCompareDistances(ToExact(x), ToExact(a), ToExact(b));
  if (sign != 0) return sign;
  return SymbolicCompareDistances(x, a, b);
}